

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_UTP(TT_ExecContext exc,FT_Long *args)

{
  FT_Byte *pFVar1;
  ulong uVar2;
  byte local_1b;
  FT_Byte mask;
  FT_UShort point;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  if ((ushort)*args < (exc->zp0).n_points) {
    local_1b = 0xff;
    if ((exc->GS).freeVector.x != 0) {
      local_1b = 0xf7;
    }
    if ((exc->GS).freeVector.y != 0) {
      local_1b = local_1b & 0xef;
    }
    pFVar1 = (exc->zp0).tags;
    uVar2 = *args & 0xffff;
    pFVar1[uVar2] = pFVar1[uVar2] & local_1b;
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  return;
}

Assistant:

static void
  Ins_UTP( TT_ExecContext  exc,
           FT_Long*        args )
  {
    FT_UShort  point;
    FT_Byte    mask;


    point = (FT_UShort)args[0];

    if ( BOUNDS( point, exc->zp0.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      return;
    }

    mask = 0xFF;

    if ( exc->GS.freeVector.x != 0 )
      mask &= ~FT_CURVE_TAG_TOUCH_X;

    if ( exc->GS.freeVector.y != 0 )
      mask &= ~FT_CURVE_TAG_TOUCH_Y;

    exc->zp0.tags[point] &= mask;
  }